

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t * Gia_SimCollectBest(Vec_Flt_t *vQuo)

{
  Vec_Int_t *p;
  long lVar1;
  int i;
  float fVar2;
  float fVar3;
  
  if ((long)vQuo->nSize != 0) {
    fVar3 = *vQuo->pArray;
    for (lVar1 = 1; lVar1 < vQuo->nSize; lVar1 = lVar1 + 1) {
      fVar2 = vQuo->pArray[lVar1];
      if (fVar2 <= fVar3) {
        fVar2 = fVar3;
      }
      fVar3 = fVar2;
    }
    i = 0;
    if (0.0 < fVar3) {
      p = Vec_IntAlloc(100);
      for (; i < vQuo->nSize; i = i + 1) {
        fVar2 = Vec_FltEntry(vQuo,i);
        if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
          Vec_IntPush(p,i);
        }
      }
      return p;
    }
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Gia_SimCollectBest( Vec_Flt_t * vQuo )
{
    Vec_Int_t * vRes; int i;
    float Value, ValueMax = Vec_FltFindMax( vQuo );
    if ( ValueMax <= 0 )
        return NULL;
    vRes = Vec_IntAlloc( 100 );  // variables with max quo
    Vec_FltForEachEntry( vQuo, Value, i )
        if ( Value == ValueMax )
            Vec_IntPush( vRes, i );
    return vRes;
}